

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

void __thiscall
TPZFMatrix<float>::TPZFMatrix
          (TPZFMatrix<float> *this,int64_t rows,int64_t cols,float *buf,int64_t sz)

{
  float *pfVar1;
  ulong uVar2;
  
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = cols;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181dbe8;
  this->fElem = buf;
  this->fGiven = buf;
  this->fSize = sz;
  pfVar1 = (float *)0x0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  (this->fWork).fStore = (float *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar2 = cols * rows;
  if (uVar2 != 0) {
    if (uVar2 - sz == 0 || (long)uVar2 < sz) {
      return;
    }
    pfVar1 = (float *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
  }
  this->fElem = pfVar1;
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,TVar * buf,const int64_t sz)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),TPZMatrix<TVar>( rows, cols ), 
fElem(buf),fGiven(buf),fSize(sz) {
    int64_t size = rows * cols;
    if(size == 0)
    {
        fElem = NULL;
    }
    else if(size > sz)
    {
        fElem=new TVar[size];
#ifndef PZNODEBUG
        if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    }
}